

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathEvaluatePredicateResult(xmlXPathParserContextPtr ctxt,xmlXPathObjectPtr res)

{
  xmlGenericErrorFunc p_Var1;
  xmlNodeSetPtr pxVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  uint uVar5;
  bool bVar6;
  
  uVar5 = 0;
  if (res == (xmlXPathObjectPtr)0x0 || ctxt == (xmlXPathParserContextPtr)0x0) {
    return 0;
  }
  switch(res->type) {
  case XPATH_NODESET:
  case XPATH_XSLT_TREE:
    pxVar2 = res->nodesetval;
    goto LAB_001e67c1;
  case XPATH_BOOLEAN:
    uVar5 = res->boolval;
    break;
  case XPATH_NUMBER:
    uVar5 = -(uint)((double)ctxt->context->proximityPosition == res->floatval) & 1;
    break;
  case XPATH_STRING:
    if (res->stringval == (xmlChar *)0x0) {
      return 0;
    }
    bVar6 = *res->stringval == '\0';
    goto LAB_001e6820;
  default:
    pp_Var3 = __xmlGenericError();
    p_Var1 = *pp_Var3;
    ppvVar4 = __xmlGenericErrorContext();
    uVar5 = 0;
    (*p_Var1)(*ppvVar4,"Internal error at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c",
              0x36e6);
    break;
  case XPATH_LOCATIONSET:
    pxVar2 = (xmlNodeSetPtr)res->user;
LAB_001e67c1:
    if (pxVar2 != (xmlNodeSetPtr)0x0) {
      bVar6 = pxVar2->nodeNr == 0;
LAB_001e6820:
      uVar5 = (uint)!bVar6;
    }
  }
  return uVar5;
}

Assistant:

int
xmlXPathEvaluatePredicateResult(xmlXPathParserContextPtr ctxt,
                                xmlXPathObjectPtr res) {
    if ((ctxt == NULL) || (res == NULL)) return(0);
    switch (res->type) {
        case XPATH_BOOLEAN:
	    return(res->boolval);
        case XPATH_NUMBER:
#if defined(__BORLANDC__) || (defined(_MSC_VER) && (_MSC_VER == 1200))
	    return((res->floatval == ctxt->context->proximityPosition) &&
	           (!xmlXPathIsNaN(res->floatval))); /* MSC pbm Mark Vakoc !*/
#else
	    return(res->floatval == ctxt->context->proximityPosition);
#endif
        case XPATH_NODESET:
        case XPATH_XSLT_TREE:
	    if (res->nodesetval == NULL)
		return(0);
	    return(res->nodesetval->nodeNr != 0);
        case XPATH_STRING:
	    return((res->stringval != NULL) && (res->stringval[0] != 0));
#ifdef LIBXML_XPTR_ENABLED
	case XPATH_LOCATIONSET:{
	    xmlLocationSetPtr ptr = res->user;
	    if (ptr == NULL)
	        return(0);
	    return (ptr->locNr != 0);
	    }
#endif
        default:
	    STRANGE
    }
    return(0);
}